

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Kernel::PolyNf::SubtermIter> * __thiscall
Lib::OptionBase<Kernel::PolyNf::SubtermIter>::operator=
          (OptionBase<Kernel::PolyNf::SubtermIter> *this,
          OptionBase<Kernel::PolyNf::SubtermIter> *other)

{
  byte *in_RSI;
  OptionBase<Kernel::PolyNf::SubtermIter> *in_RDI;
  SubtermIter *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX local_30 [32];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Kernel::PolyNf::SubtermIter> *)0x7150c7);
    Kernel::PolyNf::SubtermIter::~SubtermIter((SubtermIter *)0x7150cf);
  }
  if ((*local_10 & 1) != 0) {
    unwrap((OptionBase<Kernel::PolyNf::SubtermIter> *)0x7150f1);
    move_if_value<Kernel::PolyNf::SubtermIter,_true>(in_stack_ffffffffffffffb8);
    MaybeUninit<Kernel::PolyNf::SubtermIter>::init(&in_RDI->_elem,local_30);
    Kernel::PolyNf::SubtermIter::~SubtermIter((SubtermIter *)0x715117);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }